

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O1

int __thiscall CEditorMap::Save(CEditorMap *this,IStorage *pStorage,char *pFileName)

{
  char *pcVar1;
  char cVar2;
  undefined4 uVar3;
  long lVar4;
  IConsole *pIVar5;
  CEditorImage *this_00;
  undefined4 uVar9;
  CLayerGroup *pCVar6;
  CLayer *pCVar7;
  CLayerTiles *this_01;
  IClient *pIVar8;
  uint *puVar10;
  int iVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  void *pData;
  CEnvelope *pCVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint size;
  uint *puVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  void *dest;
  long lVar24;
  long in_FS_OFFSET;
  CDataFileWriter df;
  undefined4 local_244c;
  char aMapName [128];
  CMapItemVersion Item;
  int local_23c0;
  int iStack_23bc;
  undefined8 local_23b4;
  uint local_23ac;
  undefined8 local_23a8;
  undefined8 uStack_23a0;
  ulong local_2398;
  int local_2390;
  int local_238c;
  uint local_2388 [56];
  char local_22a8 [632];
  undefined8 local_2030;
  undefined8 local_1030;
  char aBuf [256];
  
  local_1030 = 0;
  local_2030 = 0;
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  str_format(aBuf,0x100,"saving to \'%s\'...",pFileName);
  pIVar5 = this->m_pEditor->m_pConsole;
  (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])(pIVar5,0,"editor",aBuf,0);
  CDataFileWriter::CDataFileWriter(&df);
  bVar12 = CDataFileWriter::Open(&df,pStorage,pFileName);
  if (bVar12) {
    Item.m_Version = 1;
    CDataFileWriter::AddItem(&df,0,0,4,&Item);
    Item.m_Version = 1;
    if ((this->m_MapInfo).m_aAuthor[0] != '\0') {
      iVar13 = str_length((this->m_MapInfo).m_aAuthor);
      CDataFileWriter::AddData(&df,iVar13 + 1,&this->m_MapInfo);
    }
    if ((this->m_MapInfo).m_aVersion[0] != '\0') {
      pcVar1 = (this->m_MapInfo).m_aVersion;
      iVar13 = str_length(pcVar1);
      CDataFileWriter::AddData(&df,iVar13 + 1,pcVar1);
    }
    iVar13 = -1;
    if ((this->m_MapInfo).m_aCredits[0] != '\0') {
      pcVar1 = (this->m_MapInfo).m_aCredits;
      iVar14 = str_length(pcVar1);
      CDataFileWriter::AddData(&df,iVar14 + 1,pcVar1);
    }
    if ((this->m_MapInfo).m_aLicense[0] != '\0') {
      pcVar1 = (this->m_MapInfo).m_aLicense;
      iVar13 = str_length(pcVar1);
      iVar13 = CDataFileWriter::AddData(&df,iVar13 + 1,pcVar1);
    }
    local_23b4 = CONCAT44(local_23b4._4_4_,iVar13);
    CDataFileWriter::AddItem(&df,1,0,0x14,&Item);
    if (0 < (this->m_lImages).num_elements) {
      lVar24 = 0;
      do {
        this_00 = (this->m_lImages).list[lVar24];
        CEditorImage::AnalyzeTileFlags(this_00);
        Item.m_Version = 2;
        uVar3 = (this_00->super_CImageInfo).m_Width;
        uVar9 = (this_00->super_CImageInfo).m_Height;
        iVar13 = str_length(this_00->m_aName);
        iVar13 = CDataFileWriter::AddData(&df,iVar13 + 1,this_00->m_aName);
        local_23b4 = CONCAT44(local_23b4._4_4_,iVar13);
        if (this_00->m_External == 0) {
          iVar13 = CDataFileWriter::AddData
                             (&df,uVar9 * uVar3 *
                                  (4 - (uint)((this_00->super_CImageInfo).m_Format == 0)),
                              (this_00->super_CImageInfo).m_pData);
          local_23b4 = CONCAT44(iVar13,(uint)local_23b4);
        }
        else {
          local_23b4 = CONCAT44(0xffffffff,iVar13);
        }
        local_23ac = (this_00->super_CImageInfo).m_Format;
        CDataFileWriter::AddItem(&df,2,(int)lVar24,0x1c,&Item);
        lVar24 = lVar24 + 1;
      } while (lVar24 < (this->m_lImages).num_elements);
    }
    if (0 < (this->m_lGroups).num_elements) {
      lVar24 = 0;
      iVar13 = 0;
      iVar14 = 0;
      do {
        pCVar6 = (this->m_lGroups).list[lVar24];
        if (pCVar6->m_SaveToMap == true) {
          aMapName[0] = '\x03';
          aMapName[1] = '\0';
          aMapName[2] = '\0';
          aMapName[3] = '\0';
          aMapName._4_8_ = *(undefined8 *)&pCVar6->m_OffsetX;
          aMapName._12_8_ = *(undefined8 *)&pCVar6->m_ParallaxX;
          aMapName._28_8_ = *(undefined8 *)&pCVar6->m_UseClipping;
          aMapName._36_8_ = *(undefined8 *)&pCVar6->m_ClipY;
          aMapName._44_4_ = pCVar6->m_ClipH;
          aMapName[0x18] = '\0';
          aMapName[0x19] = '\0';
          aMapName[0x1a] = '\0';
          aMapName[0x1b] = '\0';
          iVar16 = 3;
          iVar17 = 0;
          puVar10 = (uint *)(aMapName + 0x30);
          do {
            puVar19 = puVar10;
            Item.m_Version = 0;
            lVar23 = 0;
            do {
              if (pCVar6->m_aName[lVar23 + iVar17] == '\0') {
                iVar18 = iVar17 + (int)lVar23;
                break;
              }
              *(char *)((long)&Item.m_Version + lVar23) = pCVar6->m_aName[lVar23 + iVar17];
              lVar23 = lVar23 + 1;
              iVar18 = iVar17 + 4;
            } while (lVar23 != 4);
            iVar17 = iVar18;
            *puVar19 = (int)Item.m_Version._3_1_ + 0x80U | Item.m_Version._2_1_ * 0x100 + 0x8000U |
                       Item.m_Version._1_1_ * 0x10000 + 0x800000U |
                       (Item.m_Version ^ 0xffffff80U) << 0x18;
            iVar16 = iVar16 + -1;
            puVar10 = puVar19 + 1;
          } while (iVar16 != 0);
          *(char *)puVar19 = '\0';
          aMapName._20_4_ = iVar14;
          if (0 < (pCVar6->m_lLayers).num_elements) {
            lVar23 = 0;
            do {
              pCVar7 = (pCVar6->m_lLayers).list[lVar23];
              if (pCVar7->m_SaveToMap == true) {
                iVar16 = pCVar7->m_Type;
                if (iVar16 == 3) {
                  pIVar5 = this->m_pEditor->m_pConsole;
                  (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])
                            (pIVar5,1,"editor","saving quads layer");
                  pCVar7 = (pCVar6->m_lLayers).list[lVar23];
                  iVar16 = *(int *)(pCVar7[1].m_aName + 4);
                  if (iVar16 != 0) {
                    Item.m_Version = 0;
                    local_23ac = *(uint *)&pCVar7[1]._vptr_CLayer;
                    local_23b4 = CONCAT44(local_23b4._4_4_,iVar16);
                    iVar16 = CDataFileWriter::AddDataSwapped(&df,iVar16 * 0x98,pCVar7[1].m_pEditor);
                    local_23b4 = CONCAT44(iVar16,(uint)local_23b4);
                    iVar16 = 3;
                    iVar17 = 0;
                    puVar10 = (uint *)&local_23a8;
                    do {
                      puVar19 = puVar10;
                      local_244c = 0;
                      lVar21 = 0;
                      do {
                        if (pCVar7->m_aName[lVar21 + iVar17] == '\0') {
                          iVar18 = iVar17 + (int)lVar21;
                          break;
                        }
                        aMapName[lVar21 + -4] = pCVar7->m_aName[lVar21 + iVar17];
                        lVar21 = lVar21 + 1;
                        iVar18 = iVar17 + 4;
                      } while (lVar21 != 4);
                      iVar17 = iVar18;
                      *puVar19 = (int)local_244c._3_1_ + 0x80U | local_244c._2_1_ * 0x100 + 0x8000U
                                 | local_244c._1_1_ * 0x10000 + 0x800000U |
                                   (local_244c ^ 0xffffff80) << 0x18;
                      iVar16 = iVar16 + -1;
                      puVar10 = puVar19 + 1;
                    } while (iVar16 != 0);
                    *(undefined1 *)puVar19 = 0;
                    CDataFileWriter::AddItem(&df,5,iVar14,0x28,&Item);
                    goto LAB_001a5acc;
                  }
                }
                else if (iVar16 == 2) {
                  pIVar5 = this->m_pEditor->m_pConsole;
                  (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])(pIVar5,1,"editor");
                  this_01 = (CLayerTiles *)(pCVar6->m_lLayers).list[lVar23];
                  CLayerTiles::PrepareForSave(this_01);
                  Item.m_Version = 0;
                  local_23a8._0_4_ = (this_01->m_Color).r;
                  local_23a8._4_4_ = (this_01->m_Color).g;
                  uStack_23a0._0_4_ = (this_01->m_Color).b;
                  uStack_23a0._4_4_ = (this_01->m_Color).a;
                  local_2398._0_4_ = this_01->m_ColorEnv;
                  local_2398._4_4_ = this_01->m_ColorEnvOffset;
                  local_23b4._0_4_ = this_01->m_Width;
                  local_23b4._4_4_ = this_01->m_Height;
                  local_23ac = (uint)(this_01->m_Game != 0);
                  local_2390 = this_01->m_Image;
                  local_238c = CDataFileWriter::AddData
                                         (&df,this_01->m_SaveTilesSize,this_01->m_pSaveTiles);
                  iVar16 = 3;
                  iVar17 = 0;
                  puVar10 = local_2388;
                  do {
                    puVar19 = puVar10;
                    local_244c = 0;
                    lVar21 = 0;
                    do {
                      cVar2 = (this_01->super_CLayer).m_aName[lVar21 + iVar17];
                      if (cVar2 == '\0') {
                        iVar18 = iVar17 + (int)lVar21;
                        break;
                      }
                      aMapName[lVar21 + -4] = cVar2;
                      lVar21 = lVar21 + 1;
                      iVar18 = iVar17 + 4;
                    } while (lVar21 != 4);
                    iVar17 = iVar18;
                    *puVar19 = (int)local_244c._3_1_ + 0x80U | local_244c._2_1_ * 0x100 + 0x8000U |
                               local_244c._1_1_ * 0x10000 + 0x800000U |
                               (local_244c ^ 0xffffff80) << 0x18;
                    iVar16 = iVar16 + -1;
                    puVar10 = puVar19 + 1;
                  } while (iVar16 != 0);
                  *(undefined1 *)puVar19 = 0;
                  CDataFileWriter::AddItem(&df,5,iVar14,0x48,&Item);
LAB_001a5acc:
                  aMapName._24_4_ = aMapName._24_4_ + 1;
                  iVar14 = iVar14 + 1;
                }
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 < (pCVar6->m_lLayers).num_elements);
          }
          CDataFileWriter::AddItem(&df,4,iVar13,0x3c,aMapName);
          iVar13 = iVar13 + 1;
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 < (this->m_lGroups).num_elements);
    }
    lVar24 = (long)(this->m_lEnvelopes).num_elements;
    if (lVar24 < 1) {
      lVar23 = 0x18;
      iVar13 = 2;
    }
    else {
      iVar13 = 2;
      lVar23 = 0x18;
      lVar21 = 0;
      do {
        pCVar15 = (this->m_lEnvelopes).list[lVar21];
        lVar20 = (long)(pCVar15->m_lPoints).num_elements;
        if (0 < lVar20) {
          lVar22 = 0;
          do {
            if (*(int *)((long)(((pCVar15->m_lPoints).list)->super_CEnvPoint_v1).m_aValues +
                        lVar22 + -4) == 5) {
              lVar23 = 0x58;
              iVar13 = 3;
              break;
            }
            lVar22 = lVar22 + 0x58;
          } while (lVar20 * 0x58 - lVar22 != 0);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != lVar24);
    }
    if ((this->m_lEnvelopes).num_elements < 1) {
      iVar14 = 0;
    }
    else {
      lVar24 = 0;
      iVar14 = 0;
      do {
        pCVar15 = (this->m_lEnvelopes).list[lVar24];
        iVar16 = (pCVar15->m_lPoints).num_elements;
        local_2398 = (ulong)CONCAT14(pCVar15->m_Synchronized,(undefined4)local_2398);
        iVar17 = 8;
        iVar18 = 0;
        puVar10 = (uint *)&local_23b4;
        do {
          puVar19 = puVar10;
          aMapName[0] = '\0';
          aMapName[1] = '\0';
          aMapName[2] = '\0';
          aMapName[3] = '\0';
          lVar21 = 0;
          do {
            if (pCVar15->m_aName[lVar21 + iVar18] == '\0') {
              iVar11 = iVar18 + (int)lVar21;
              break;
            }
            aMapName[lVar21] = pCVar15->m_aName[lVar21 + iVar18];
            lVar21 = lVar21 + 1;
            iVar11 = iVar18 + 4;
          } while (lVar21 != 4);
          iVar18 = iVar11;
          *puVar19 = (int)aMapName[3] + 0x80U | aMapName[2] * 0x100 + 0x8000U |
                     aMapName[1] * 0x10000 + 0x800000U | (aMapName._0_4_ ^ 0xffffff80) << 0x18;
          iVar17 = iVar17 + -1;
          puVar10 = puVar19 + 1;
        } while (iVar17 != 0);
        *(undefined1 *)puVar19 = 0;
        Item.m_Version = iVar13;
        CDataFileWriter::AddItem(&df,3,(int)lVar24,0x34,&Item);
        iVar14 = iVar14 + iVar16;
        lVar24 = lVar24 + 1;
      } while (lVar24 < (this->m_lEnvelopes).num_elements);
    }
    size = (uint)lVar23;
    pData = mem_alloc(iVar14 * size);
    if (0 < (this->m_lEnvelopes).num_elements) {
      lVar24 = 0;
      iVar13 = 0;
      do {
        pCVar15 = (this->m_lEnvelopes).list[lVar24];
        if (0 < (pCVar15->m_lPoints).num_elements) {
          dest = (void *)((long)iVar13 + (long)pData);
          lVar20 = 0;
          lVar21 = 0;
          do {
            mem_copy(dest,(void *)((long)(((pCVar15->m_lPoints).list)->super_CEnvPoint_v1).m_aValues
                                  + lVar20 + -8),size);
            lVar21 = lVar21 + 1;
            pCVar15 = (this->m_lEnvelopes).list[lVar24];
            dest = (void *)((long)dest + lVar23);
            iVar13 = iVar13 + size;
            lVar20 = lVar20 + 0x58;
          } while (lVar21 < (pCVar15->m_lPoints).num_elements);
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 < (this->m_lEnvelopes).num_elements);
    }
    CDataFileWriter::AddItem(&df,6,0,iVar14 * size,pData);
    mem_free(pData);
    CDataFileWriter::Finish(&df);
    pIVar5 = this->m_pEditor->m_pConsole;
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])(pIVar5,1,"editor","saving done",0);
    iVar14 = (*(this->m_pEditor->m_pClient->super_IInterface)._vptr_IInterface[0x1a])();
    iVar13 = 1;
    if ((char)iVar14 != '\0') {
      pIVar8 = this->m_pEditor->m_pClient;
      (*(pIVar8->super_IInterface)._vptr_IInterface[0x1d])(pIVar8,&Item);
      CEditor::ExtractName(pFileName,aMapName,0x80);
      iVar14 = str_comp(aMapName,local_22a8);
      if (iVar14 == 0) {
        pIVar8 = this->m_pEditor->m_pClient;
        (*(pIVar8->super_IInterface)._vptr_IInterface[0x1c])(pIVar8,"reload");
      }
    }
  }
  else {
    iVar13 = 0;
    str_format(aBuf,0x100,"failed to open file \'%s\'...",pFileName);
    pIVar5 = this->m_pEditor->m_pConsole;
    (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])(pIVar5,0,"editor",aBuf,0);
  }
  CDataFileWriter::~CDataFileWriter(&df);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return iVar13;
}

Assistant:

int CEditorMap::Save(class IStorage *pStorage, const char *pFileName)
{
	char aBuf[256];
	str_format(aBuf, sizeof(aBuf), "saving to '%s'...", pFileName);
	m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "editor", aBuf);
	CDataFileWriter df;
	if(!df.Open(pStorage, pFileName))
	{
		str_format(aBuf, sizeof(aBuf), "failed to open file '%s'...", pFileName);
		m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "editor", aBuf);
		return 0;
	}

	// save version
	{
		CMapItemVersion Item;
		Item.m_Version = CMapItemVersion::CURRENT_VERSION;
		df.AddItem(MAPITEMTYPE_VERSION, 0, sizeof(Item), &Item);
	}

	// save map info
	{
		CMapItemInfo Item;
		Item.m_Version = CMapItemInfo::CURRENT_VERSION;

		if(m_MapInfo.m_aAuthor[0])
			Item.m_Author = df.AddData(str_length(m_MapInfo.m_aAuthor)+1, m_MapInfo.m_aAuthor);
		else
			Item.m_Author = -1;
		if(m_MapInfo.m_aVersion[0])
			Item.m_MapVersion = df.AddData(str_length(m_MapInfo.m_aVersion)+1, m_MapInfo.m_aVersion);
		else
			Item.m_MapVersion = -1;
		if(m_MapInfo.m_aCredits[0])
			Item.m_Credits = df.AddData(str_length(m_MapInfo.m_aCredits)+1, m_MapInfo.m_aCredits);
		else
			Item.m_Credits = -1;
		if(m_MapInfo.m_aLicense[0])
			Item.m_License = df.AddData(str_length(m_MapInfo.m_aLicense)+1, m_MapInfo.m_aLicense);
		else
			Item.m_License = -1;

		df.AddItem(MAPITEMTYPE_INFO, 0, sizeof(Item), &Item);
	}

	// save images
	for(int i = 0; i < m_lImages.size(); i++)
	{
		CEditorImage *pImg = m_lImages[i];

		// analyze the image for when saving (should be done when we load the image)
		// TODO!
		pImg->AnalyzeTileFlags();

		CMapItemImage Item;
		Item.m_Version = CMapItemImage::CURRENT_VERSION;

		Item.m_Width = pImg->m_Width;
		Item.m_Height = pImg->m_Height;
		Item.m_External = pImg->m_External;
		Item.m_ImageName = df.AddData(str_length(pImg->m_aName)+1, pImg->m_aName);
		if(pImg->m_External)
			Item.m_ImageData = -1;
		else
		{
			int PixelSize = pImg->m_Format == CImageInfo::FORMAT_RGB ? 3 : 4;
			Item.m_ImageData = df.AddData(Item.m_Width*Item.m_Height*PixelSize, pImg->m_pData);
		}
		Item.m_Format = pImg->m_Format;
		df.AddItem(MAPITEMTYPE_IMAGE, i, sizeof(Item), &Item);
	}

	// save layers
	int LayerCount = 0, GroupCount = 0;
	for(int g = 0; g < m_lGroups.size(); g++)
	{
		CLayerGroup *pGroup = m_lGroups[g];
		if(!pGroup->m_SaveToMap)
			continue;

		CMapItemGroup GItem;
		GItem.m_Version = CMapItemGroup::CURRENT_VERSION;

		GItem.m_ParallaxX = pGroup->m_ParallaxX;
		GItem.m_ParallaxY = pGroup->m_ParallaxY;
		GItem.m_OffsetX = pGroup->m_OffsetX;
		GItem.m_OffsetY = pGroup->m_OffsetY;
		GItem.m_UseClipping = pGroup->m_UseClipping;
		GItem.m_ClipX = pGroup->m_ClipX;
		GItem.m_ClipY = pGroup->m_ClipY;
		GItem.m_ClipW = pGroup->m_ClipW;
		GItem.m_ClipH = pGroup->m_ClipH;
		GItem.m_StartLayer = LayerCount;
		GItem.m_NumLayers = 0;

		// save group name
		StrToInts(GItem.m_aName, sizeof(GItem.m_aName)/sizeof(int), pGroup->m_aName);

		for(int l = 0; l < pGroup->m_lLayers.size(); l++)
		{
			if(!pGroup->m_lLayers[l]->m_SaveToMap)
				continue;

			if(pGroup->m_lLayers[l]->m_Type == LAYERTYPE_TILES)
			{
				m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "editor", "saving tiles layer");
				CLayerTiles *pLayer = (CLayerTiles *)pGroup->m_lLayers[l];
				pLayer->PrepareForSave();

				CMapItemLayerTilemap Item;
				Item.m_Version = CMapItemLayerTilemap::CURRENT_VERSION;

				Item.m_Layer.m_Version = 0; // unused
				Item.m_Layer.m_Flags = pLayer->m_Flags;
				Item.m_Layer.m_Type = pLayer->m_Type;

				Item.m_Color = pLayer->m_Color;
				Item.m_ColorEnv = pLayer->m_ColorEnv;
				Item.m_ColorEnvOffset = pLayer->m_ColorEnvOffset;

				Item.m_Width = pLayer->m_Width;
				Item.m_Height = pLayer->m_Height;
				Item.m_Flags = pLayer->m_Game ? TILESLAYERFLAG_GAME : 0;
				Item.m_Image = pLayer->m_Image;
				Item.m_Data = df.AddData(pLayer->m_SaveTilesSize, pLayer->m_pSaveTiles);

				// save layer name
				StrToInts(Item.m_aName, sizeof(Item.m_aName)/sizeof(int), pLayer->m_aName);

				df.AddItem(MAPITEMTYPE_LAYER, LayerCount, sizeof(Item), &Item);

				GItem.m_NumLayers++;
				LayerCount++;
			}
			else if(pGroup->m_lLayers[l]->m_Type == LAYERTYPE_QUADS)
			{
				m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "editor", "saving quads layer");
				CLayerQuads *pLayer = (CLayerQuads *)pGroup->m_lLayers[l];
				if(pLayer->m_lQuads.size())
				{
					CMapItemLayerQuads Item;
					Item.m_Version = CMapItemLayerQuads::CURRENT_VERSION;
					Item.m_Layer.m_Version = 0; // unused
					Item.m_Layer.m_Flags = pLayer->m_Flags;
					Item.m_Layer.m_Type = pLayer->m_Type;
					Item.m_Image = pLayer->m_Image;

					// add the data
					Item.m_NumQuads = pLayer->m_lQuads.size();
					Item.m_Data = df.AddDataSwapped(pLayer->m_lQuads.size()*sizeof(CQuad), pLayer->m_lQuads.base_ptr());

					// save layer name
					StrToInts(Item.m_aName, sizeof(Item.m_aName)/sizeof(int), pLayer->m_aName);

					df.AddItem(MAPITEMTYPE_LAYER, LayerCount, sizeof(Item), &Item);

					GItem.m_NumLayers++;
					LayerCount++;
				}
			}
		}

		df.AddItem(MAPITEMTYPE_GROUP, GroupCount++, sizeof(GItem), &GItem);
	}

	// check for bezier curve envelopes, otherwise use older, smaller envelope points
	int Version = CMapItemEnvelope_v2::CURRENT_VERSION;
	int Size = sizeof(CEnvPoint_v1);
	for(int e = 0; e < m_lEnvelopes.size(); e++)
	{
		for(int p = 0; p < m_lEnvelopes[e]->m_lPoints.size(); p++)
		{
			if(m_lEnvelopes[e]->m_lPoints[p].m_Curvetype == CURVETYPE_BEZIER)
			{
				Version = CMapItemEnvelope::CURRENT_VERSION;
				Size = sizeof(CEnvPoint);
				break;
			}
		}
	}

	// save envelopes
	int PointCount = 0;
	for(int e = 0; e < m_lEnvelopes.size(); e++)
	{
		CMapItemEnvelope Item;
		Item.m_Version = Version;
		Item.m_Channels = m_lEnvelopes[e]->m_Channels;
		Item.m_StartPoint = PointCount;
		Item.m_NumPoints = m_lEnvelopes[e]->m_lPoints.size();
		Item.m_Synchronized = m_lEnvelopes[e]->m_Synchronized;
		StrToInts(Item.m_aName, sizeof(Item.m_aName)/sizeof(int), m_lEnvelopes[e]->m_aName);

		df.AddItem(MAPITEMTYPE_ENVELOPE, e, sizeof(Item), &Item);
		PointCount += Item.m_NumPoints;
	}

	// save points
	int TotalSize = Size * PointCount;
	unsigned char *pPoints = (unsigned char *)mem_alloc(TotalSize);
	int Offset = 0;
	for(int e = 0; e < m_lEnvelopes.size(); e++)
	{
		for(int p = 0; p < m_lEnvelopes[e]->m_lPoints.size(); p++)
		{
			mem_copy(pPoints + Offset, &(m_lEnvelopes[e]->m_lPoints[p]), Size);
			Offset += Size;
		}
	}

	df.AddItem(MAPITEMTYPE_ENVPOINTS, 0, TotalSize, pPoints);
	mem_free(pPoints);

	// finish the data file
	df.Finish();
	m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "editor", "saving done");

	// send rcon.. if we can
	if(m_pEditor->Client()->RconAuthed())
	{
		CServerInfo CurrentServerInfo;
		m_pEditor->Client()->GetServerInfo(&CurrentServerInfo);
		char aMapName[128];
		m_pEditor->ExtractName(pFileName, aMapName, sizeof(aMapName));
		if(!str_comp(aMapName, CurrentServerInfo.m_aMap))
			m_pEditor->Client()->Rcon("reload");
	}

	return 1;
}